

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42parse.c
# Opt level: O0

FT_Error t42_load_keyword(T42_Face face,T42_Loader loader,T1_Field field)

{
  T1_FieldLocation TVar1;
  FT_UInt max_objects;
  void **objects;
  void *dummy_object;
  T1_Field pTStack_20;
  FT_Error error;
  T1_Field field_local;
  T42_Loader loader_local;
  T42_Face face_local;
  
  pTStack_20 = field;
  field_local = (T1_Field)loader;
  loader_local = (T42_Loader)face;
  if (field->type == T1_FIELD_TYPE_CALLBACK) {
    (*field->reader)(&face->root,loader);
    dummy_object._4_4_ = field_local->offset;
  }
  else {
    TVar1 = field->location;
    if (TVar1 == T1_FIELD_LOCATION_FONT_EXTRA) {
      objects = (void **)&(face->type1).font_extra;
    }
    else if (TVar1 == T1_FIELD_LOCATION_FONT_INFO) {
      objects = (void **)&face->type1;
    }
    else if (TVar1 == T1_FIELD_LOCATION_BBOX) {
      objects = (void **)&(face->type1).font_bbox;
    }
    else {
      objects = (void **)&face->type1;
    }
    if ((field->type == T1_FIELD_TYPE_INTEGER_ARRAY) || (field->type == T1_FIELD_TYPE_FIXED_ARRAY))
    {
      dummy_object._4_4_ =
           (*(loader->parser).root.funcs.load_field_table)
                     ((PS_Parser)loader,field,&objects,0,(FT_ULong *)0x0);
    }
    else {
      dummy_object._4_4_ =
           (*(loader->parser).root.funcs.load_field)
                     ((PS_Parser)loader,field,&objects,0,(FT_ULong *)0x0);
    }
  }
  return dummy_object._4_4_;
}

Assistant:

static FT_Error
  t42_load_keyword( T42_Face    face,
                    T42_Loader  loader,
                    T1_Field    field )
  {
    FT_Error  error;
    void*     dummy_object;
    void**    objects;
    FT_UInt   max_objects = 0;


    /* if the keyword has a dedicated callback, call it */
    if ( field->type == T1_FIELD_TYPE_CALLBACK )
    {
      field->reader( (FT_Face)face, loader );
      error = loader->parser.root.error;
      goto Exit;
    }

    /* now the keyword is either a simple field or a table of fields; */
    /* we are now going to take care of it                            */

    switch ( field->location )
    {
    case T1_FIELD_LOCATION_FONT_INFO:
      dummy_object = &face->type1.font_info;
      break;

    case T1_FIELD_LOCATION_FONT_EXTRA:
      dummy_object = &face->type1.font_extra;
      break;

    case T1_FIELD_LOCATION_BBOX:
      dummy_object = &face->type1.font_bbox;
      break;

    default:
      dummy_object = &face->type1;
    }

    objects = &dummy_object;

    if ( field->type == T1_FIELD_TYPE_INTEGER_ARRAY ||
         field->type == T1_FIELD_TYPE_FIXED_ARRAY   )
      error = T1_Load_Field_Table( &loader->parser, field,
                                   objects, max_objects, 0 );
    else
      error = T1_Load_Field( &loader->parser, field,
                             objects, max_objects, 0 );

   Exit:
    return error;
  }